

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *config;
  const_iterator __position;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  CommandRunner *pCVar6;
  RealCommandRunner *this_00;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  Edge *this_01;
  CommandRunner *pCVar10;
  int iVar11;
  int iVar12;
  Result result;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Plan *local_40;
  _Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *local_38;
  
  if (((this->plan_).wanted_edges_ < 1) || ((this->plan_).command_edges_ < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0x289,"bool Builder::Build(string *)");
  }
  (**this->status_->_vptr_Status)();
  config = this->config_;
  iVar12 = *(int *)(config + 0x10);
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (config[4] == (BuildConfig)0x1) {
      pCVar6 = (CommandRunner *)operator_new(0x58);
      pCVar6->_vptr_CommandRunner = (_func_int **)&PTR__DryRunCommandRunner_00136908;
      pCVar6[1]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[2]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[3]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[4]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[5]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[6]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[7]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[8]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[9]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar6[10]._vptr_CommandRunner = (_func_int **)0x0;
      std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_M_initialize_map
                ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)(pCVar6 + 1),0);
      pCVar10 = (this->command_runner_)._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      (this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = pCVar6;
    }
    else {
      this_00 = (RealCommandRunner *)operator_new(0x308);
      RealCommandRunner::RealCommandRunner(this_00,config);
      pCVar10 = (this->command_runner_)._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      (this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = (CommandRunner *)this_00;
    }
    if (pCVar10 != (CommandRunner *)0x0) {
      (*pCVar10->_vptr_CommandRunner[1])();
    }
  }
  local_40 = &this->plan_;
  (*this->status_->_vptr_Status[4])();
  local_38 = (_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
             &(this->plan_).ready_;
  iVar11 = 0;
  do {
    bVar1 = (this->plan_).command_edges_ < 1 || (this->plan_).wanted_edges_ < 1;
    if (bVar1) {
      (*this->status_->_vptr_Status[5])();
      return bVar1;
    }
    uVar9 = 0;
    if ((iVar12 != 0) &&
       ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      uVar4 = (*((this->command_runner_)._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[2]
              )();
      uVar9 = (ulong)uVar4;
    }
    if (((char)uVar9 == '\0') ||
       (iVar5 = (*((this->command_runner_)._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner
                  [3])(), (char)iVar5 == '\0')) {
      if (iVar11 != 0) {
        local_70._0_8_ = (pointer)0x0;
        local_70._16_8_ = &local_50;
        local_70._24_8_ = 0;
        local_50._M_local_buf[0] = '\0';
        pCVar10 = (this->command_runner_)._M_t.
                  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        iVar5 = (*pCVar10->_vptr_CommandRunner[5])(pCVar10,(string *)local_70,uVar9 & 0xff);
        if (((byte)iVar5 & local_70._8_4_ != ExitInterrupted) == 0) {
          Cleanup(this);
          (*this->status_->_vptr_Status[5])();
          bVar2 = false;
          std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x1274ac);
        }
        else {
          bVar2 = true;
          if (local_70._8_4_ != ExitTokenAvailable) {
            bVar3 = FinishCommand(this,(Result *)local_70,err);
            iVar11 = iVar11 + -1;
            if (bVar3) {
              iVar12 = iVar12 - (uint)(local_70._8_4_ != ExitSuccess && iVar12 != 0);
            }
            else {
              Cleanup(this);
              (*this->status_->_vptr_Status[5])();
              bVar2 = false;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._16_8_ != &local_50) {
          operator_delete((void *)local_70._16_8_,
                          CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) +
                          1);
        }
        goto LAB_0010a2fa;
      }
      (*this->status_->_vptr_Status[5])();
      if (iVar12 == 0) {
        if (*(int *)(this->config_ + 0x10) < 2) {
          pcVar8 = (char *)err->_M_string_length;
          pcVar7 = "subcommand failed";
        }
        else {
          pcVar8 = (char *)err->_M_string_length;
          pcVar7 = "subcommands failed";
        }
      }
      else if (iVar12 < *(int *)(this->config_ + 0x10)) {
        pcVar8 = (char *)err->_M_string_length;
        pcVar7 = "cannot make progress due to previous errors";
      }
      else {
        pcVar8 = (char *)err->_M_string_length;
        pcVar7 = "stuck [this is a bug]";
      }
      iVar11 = 0;
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar8,(ulong)pcVar7);
LAB_0010a2f7:
      bVar2 = false;
    }
    else {
      if ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        this_01 = (Edge *)0x0;
      }
      else {
        __position._M_node =
             (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this_01 = *(Edge **)(__position._M_node + 1);
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
        erase_abi_cxx11_(local_38,__position);
      }
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"generator","");
      bVar2 = Edge::GetBindingBool(this_01,(string *)local_70);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      if (bVar2) {
        BuildLog::Close((this->scan_).build_log_);
      }
      bVar2 = StartEdge(this,this_01,err);
      if (!bVar2) {
LAB_0010a280:
        Cleanup(this);
        (*this->status_->_vptr_Status[5])();
        goto LAB_0010a2f7;
      }
      bVar2 = Edge::is_phony(this_01);
      if (bVar2) {
        bVar3 = Plan::EdgeFinished(local_40,this_01,kEdgeSucceeded,err);
        bVar2 = true;
        if (!bVar3) goto LAB_0010a280;
      }
      else {
        iVar11 = iVar11 + 1;
        bVar2 = true;
      }
    }
LAB_0010a2fa:
    if (!bVar2) {
      return bVar1;
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands...
    bool can_run_more =
        failures_allowed   &&
        plan_.more_ready() &&
        command_runner_->CanRunMore();

    // ... but we also need a token to do that.
    if (can_run_more && command_runner_->AcquireToken()) {
      Edge* edge = plan_.FindWork();
      if (edge->GetBindingBool("generator")) {
        scan_.build_log()->Close();
      }
      if (!StartEdge(edge, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (edge->is_phony()) {
        if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }
      } else {
        ++pending_commands;
      }

      // We made some progress; go back to the main loop.
      continue;
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result, can_run_more) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      // We might be able to start another command; start the main loop over.
      if (result.status == ExitTokenAvailable)
        continue;

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}